

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteString(ON_BinaryArchive *this,ON_String *sUTF8)

{
  bool bVar1;
  int iVar2;
  char *p;
  size_t sVar3;
  size_t count;
  ON__UINT32 ui32;
  ON__INT32 local_1c;
  
  ON_String::IsValid(sUTF8,false);
  iVar2 = ON_String::Length(sUTF8);
  count = 0;
  if (iVar2 != 0) {
    count = (long)iVar2 + 1;
  }
  local_1c = (ON__INT32)count;
  bVar1 = WriteInt32(this,1,&local_1c);
  if (count != 0 && bVar1) {
    p = ON_String::Array(sUTF8);
    sVar3 = Write(this,count,p);
    bVar1 = sVar3 == count;
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::WriteString( const ON_String& sUTF8 )
{
  // The ON_String::IsValid call prevents corrupt strings from breaking file IO
  // The parameter MUST be false here.
  sUTF8.IsValid(false);

  size_t string_utf8_element_count = sUTF8.Length();
  if ( string_utf8_element_count )
    string_utf8_element_count++;
  ON__UINT32 ui32 = (ON__UINT32)string_utf8_element_count;
  bool rc = WriteInt32(1,(ON__INT32*)&ui32);
  if ( rc && string_utf8_element_count > 0 )
    rc = WriteByte( string_utf8_element_count, sUTF8.Array() );
  return rc;  
}